

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::Container::findInstanceRetrievers
          (Container *this,
          vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
          *instanceRetrievers,component_type *type)

{
  bool bVar1;
  pointer pvVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>_*,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>
  local_48;
  const_iterator local_40;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
  *local_38;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
  *currentRetrievers;
  _Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
  local_28;
  const_iterator iter;
  component_type *type_local;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
  *instanceRetrievers_local;
  Container *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
               )type;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
       ::find(&this->registrations_,type);
  currentRetrievers =
       (vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
        *)std::
          unordered_map<cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>,_cinject::component_type_hash,_std::equal_to<cinject::component_type>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>_>
          ::end(&this->registrations_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
                      *)&currentRetrievers);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_false,_true>
                           *)&local_28);
    local_38 = &pvVar2->second;
    local_48._M_current =
         (shared_ptr<cinject::IInstanceRetriever> *)
         std::
         vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
         ::end(instanceRetrievers);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>const*,std::vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>>
    ::__normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>*>
              ((__normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>const*,std::vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>>
                *)&local_40,&local_48);
    __first = std::
              vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
              ::begin(local_38);
    __last = std::
             vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>
             ::end(local_38);
    std::
    vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::shared_ptr<cinject::IInstanceRetriever>const*,std::vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>>,void>
              ((vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
                *)instanceRetrievers,local_40,
               (__normal_iterator<const_std::shared_ptr<cinject::IInstanceRetriever>_*,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>
                )__first._M_current,
               (__normal_iterator<const_std::shared_ptr<cinject::IInstanceRetriever>_*,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>
                )__last._M_current);
  }
  if (this->parentContainer_ != (Container *)0x0) {
    findInstanceRetrievers
              (this->parentContainer_,instanceRetrievers,
               (component_type *)
               iter.
               super__Node_iterator_base<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_true>
               ._M_cur);
  }
  return;
}

Assistant:

inline void Container::findInstanceRetrievers(std::vector<std::shared_ptr<IInstanceRetriever>>& instanceRetrievers, const component_type& type) const
{
    auto iter = registrations_.find(type);
    if (iter != registrations_.end())
    {
        const std::vector<std::shared_ptr<IInstanceRetriever>>& currentRetrievers = iter->second;

        instanceRetrievers.insert(instanceRetrievers.end(), currentRetrievers.begin(), currentRetrievers.end());
    }

    if (parentContainer_ != nullptr)
    {
        parentContainer_->findInstanceRetrievers(instanceRetrievers, type);
    }
}